

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall Preprocessor::Init(Preprocessor *this)

{
  Preprocessor *pPVar1;
  int iVar2;
  time_t tVar3;
  long *plVar4;
  ostream *poVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  long local_c50;
  ifstream P;
  byte abStack_c30 [488];
  long local_a48;
  ifstream D;
  byte abStack_a28 [488];
  long local_840;
  ofstream P_A;
  byte abStack_820 [480];
  long local_640;
  ofstream P_B;
  byte abStack_620 [480];
  long local_440;
  ofstream D_A;
  byte abStack_420 [480];
  long local_240;
  ofstream D_B;
  byte abStack_220 [480];
  Preprocessor *local_40;
  int local_34 [2];
  int read;
  
  std::ifstream::ifstream(&local_c50);
  std::ifstream::ifstream(&local_a48);
  std::ofstream::ofstream(&local_840);
  std::ofstream::ofstream(&local_640);
  std::ofstream::ofstream(&local_440);
  std::ofstream::ofstream(&local_240);
  std::ifstream::open((char *)&local_c50,(_Ios_Openmode)(this->p_path)._M_dataplus._M_p);
  std::ofstream::open((char *)&local_840,(_Ios_Openmode)(this->p_A_path)._M_dataplus._M_p);
  std::ofstream::open((char *)&local_640,(_Ios_Openmode)(this->p_B_path)._M_dataplus._M_p);
  if ((abStack_c30[*(long *)(local_c50 + -0x18)] & 5) == 0) {
    if ((abStack_820[*(long *)(local_840 + -0x18)] & 5) == 0) {
      local_40 = this;
      if ((abStack_620[*(long *)(local_640 + -0x18)] & 5) == 0) {
        uVar8 = 1;
        local_34[0] = 0;
        tVar3 = time((time_t *)0x0);
        srand((uint)tVar3);
        iVar7 = -1;
        while( true ) {
          plVar4 = (long *)std::istream::operator>>((istream *)&local_c50,local_34);
          if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
          iVar2 = rand();
          local_34[0] = local_34[0] - iVar2 % 1000;
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_840,local_34[0]);
          pcVar9 = " ";
          if ((uVar8 / 5) * 5 + iVar7 == 0) {
            pcVar9 = "\n";
          }
          std::operator<<(poVar5,pcVar9);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_640,iVar2 % 1000);
          iVar7 = iVar7 + -1;
          uVar8 = uVar8 + 1;
          std::operator<<(poVar5,pcVar9);
        }
        std::ifstream::close();
        pPVar1 = local_40;
        std::ofstream::close();
        std::ofstream::close();
        std::ifstream::open((char *)&local_a48,(_Ios_Openmode)(pPVar1->d_path)._M_dataplus._M_p);
        std::ofstream::open((char *)&local_440,(_Ios_Openmode)(pPVar1->d_A_path)._M_dataplus._M_p);
        std::ofstream::open((char *)&local_240,(_Ios_Openmode)(pPVar1->d_B_path)._M_dataplus._M_p);
        if ((abStack_a28[*(long *)(local_a48 + -0x18)] & 5) == 0) {
          if ((abStack_420[*(long *)(local_440 + -0x18)] & 5) == 0) {
            if ((abStack_220[*(long *)(local_240 + -0x18)] & 5) == 0) {
              bVar6 = 0;
              while( true ) {
                plVar4 = (long *)std::istream::operator>>((istream *)&local_a48,local_34);
                if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
                iVar7 = rand();
                local_34[0] = local_34[0] - iVar7 % 1000;
                poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_440,local_34[0]);
                pcVar9 = "\n";
                if (!(bool)(bVar6 & 1)) {
                  pcVar9 = " ";
                }
                std::operator<<(poVar5,pcVar9);
                poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_240,iVar7 % 1000);
                bVar6 = bVar6 + 1;
                std::operator<<(poVar5,pcVar9);
              }
              std::ifstream::close();
              std::ofstream::close();
              std::ofstream::close();
              std::ofstream::~ofstream(&local_240);
              std::ofstream::~ofstream(&local_440);
              std::ofstream::~ofstream(&local_640);
              std::ofstream::~ofstream(&local_840);
              std::ifstream::~ifstream(&local_a48);
              std::ifstream::~ifstream(&local_c50);
              return;
            }
            poVar5 = std::operator<<((ostream *)&std::cout,
                                     "Preprocessor: Unable to create output data file at: ");
            poVar5 = std::operator<<(poVar5,(string *)&pPVar1->d_B_path);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::ios::clear((int)&local_240 + (int)*(undefined8 *)(local_240 + -0x18));
          }
          else {
            poVar5 = std::operator<<((ostream *)&std::cout,
                                     "Preprocessor: Unable to create output data file at: ");
            poVar5 = std::operator<<(poVar5,(string *)&pPVar1->d_A_path);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::ios::clear((int)&local_440 + (int)*(undefined8 *)(local_440 + -0x18));
          }
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "Preprocessor: Unable to locate input data file at: ");
          poVar5 = std::operator<<(poVar5,(string *)&pPVar1->d_path);
          std::endl<char,std::char_traits<char>>(poVar5);
          std::ios::clear((int)&local_a48 + (int)*(undefined8 *)(local_a48 + -0x18));
        }
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "Preprocessor: Unable to create output program file at: ");
        poVar5 = std::operator<<(poVar5,(string *)&local_40->p_B_path);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::ios::clear((int)&local_640 + (int)*(undefined8 *)(local_640 + -0x18));
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "Preprocessor: Unable to create output program file at: ");
      poVar5 = std::operator<<(poVar5,(string *)&this->p_A_path);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::ios::clear((int)&local_840 + (int)*(undefined8 *)(local_840 + -0x18));
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "Preprocessor: Unable to locate input program file at: ");
    poVar5 = std::operator<<(poVar5,(string *)this);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::ios::clear((int)&local_c50 + (int)*(undefined8 *)(local_c50 + -0x18));
  }
  exit(1);
}

Assistant:

void Preprocessor::Init()
{
  std::ifstream P, D;
  std::ofstream P_A, P_B, D_A, D_B;
  P.open(p_path.c_str());
  P_A.open(p_A_path.c_str());
  P_B.open(p_B_path.c_str());

  if (P.fail())
  {
    std::cout << "Preprocessor: Unable to locate input program file at: "<<p_path<<std::endl;
    P.clear();
    exit(1);
  }
  if (P_A.fail())
  {
    std::cout << "Preprocessor: Unable to create output program file at: "<<p_A_path<<std::endl;
    P_A.clear();
    exit(1);
  }
  if (P_B.fail())
  {
    std::cout << "Preprocessor: Unable to create output program file at: "<<p_B_path<<std::endl;
    P_B.clear();
    exit(1);
  }

  int read = 0, write = 0;
  int r = 0;
  int count = 0;
  bool eol = 0;
  srand(time(NULL));

  while (P >> read)
  {
    eol = ++count % 5;
    r = rand() % S_PARAM;
    read = read - r;
    P_A << read << ((eol == 0) ? "\n" : " ");
    P_B << r << ((eol == 0) ? "\n" : " ");
  }
  P.close();
  P_A.close();
  P_B.close();

  count = 0;
  eol = 0;
  D.open(d_path.c_str());
  D_A.open(d_A_path.c_str());
  D_B.open(d_B_path.c_str());
  
  if (D.fail())
  {
    std::cout << "Preprocessor: Unable to locate input data file at: "<<d_path<<std::endl;
    D.clear();
    exit(1);
  }
  if (D_A.fail())
  {
    std::cout << "Preprocessor: Unable to create output data file at: "<<d_A_path<<std::endl;
    D_A.clear();
    exit(1);
  }
  if (D_B.fail())
  {
    std::cout << "Preprocessor: Unable to create output data file at: "<<d_B_path<<std::endl;
    D_B.clear();
    exit(1);
  }
  
  while (D >> read)
  {
    eol = ++count % 2;
    r = rand() % S_PARAM;
    read = read - r;
    D_A << read << ((eol == 0) ? "\n" : " ");
    D_B << r << ((eol == 0) ? "\n" : " ");
  }
  D.close();
  D_A.close();
  D_B.close();
}